

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprand.h
# Opt level: O2

void rprand_set_seed(unsigned_long_long seed)

{
  uint64_t uVar1;
  
  rprand_seed = seed;
  uVar1 = rprand_splitmix64();
  rprand_state_0 = (undefined4)uVar1;
  uVar1 = rprand_splitmix64();
  rprand_state_1 = (undefined4)(uVar1 >> 0x20);
  uVar1 = rprand_splitmix64();
  rprand_state_2 = (undefined4)uVar1;
  uVar1 = rprand_splitmix64();
  rprand_state_3 = (int)(uVar1 >> 0x20);
  return;
}

Assistant:

void rprand_set_seed(unsigned long long seed)
{
    rprand_seed = (uint64_t)seed;    // Set SplitMix64 seed for further use

    // To generate the Xoshiro128** state, we use SplitMix64 generator first
    // We generate 4 pseudo-random 64bit numbers that we combine using their LSB|MSB
    rprand_state[0] = (uint32_t)(rprand_splitmix64() & 0xffffffff);
    rprand_state[1] = (uint32_t)((rprand_splitmix64() & 0xffffffff00000000) >> 32);
    rprand_state[2] = (uint32_t)(rprand_splitmix64() & 0xffffffff);
    rprand_state[3] = (uint32_t)((rprand_splitmix64() & 0xffffffff00000000) >> 32);
}